

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetCMakePropertyCommand::InitialPass
          (cmGetCMakePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  size_type sVar2;
  int iVar3;
  cmState *this_00;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  ulong uVar6;
  string output;
  string local_70;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  if (uVar6 < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NOTFOUND","");
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"VARIABLES","");
      pcVar4 = cmMakefile::GetProperty(pcVar1,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      sVar2 = local_70._M_string_length;
      if (pcVar4 != (char *)0x0) {
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar2,(ulong)pcVar4);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar3 == 0) {
        local_70._M_string_length = 0;
        *local_70._M_dataplus._M_p = '\0';
        pcVar1 = (this->super_cmCommand).Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MACROS","");
        pcVar4 = cmMakefile::GetProperty(pcVar1,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        sVar2 = local_70._M_string_length;
        if (pcVar4 != (char *)0x0) {
          strlen(pcVar4);
          std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar2,(ulong)pcVar4);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar3 == 0) {
          pcVar5 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_50,&pcVar5->InstallComponents,";");
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else if ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 0) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar4 = cmState::GetGlobalProperty
                             (this_00,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
          sVar2 = local_70._M_string_length;
          if (pcVar4 != (char *)0x0) {
            strlen(pcVar4);
            std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar2,(ulong)pcVar4);
          }
        }
      }
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return 0x20 < uVar6;
}

Assistant:

bool cmGetCMakePropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& variable = args[0];
  std::string output = "NOTFOUND";

  if (args[1] == "VARIABLES") {
    if (const char* varsProp = this->Makefile->GetProperty("VARIABLES")) {
      output = varsProp;
    }
  } else if (args[1] == "MACROS") {
    output.clear();
    if (const char* macrosProp = this->Makefile->GetProperty("MACROS")) {
      output = macrosProp;
    }
  } else if (args[1] == "COMPONENTS") {
    const std::set<std::string>* components =
      this->Makefile->GetGlobalGenerator()->GetInstallComponents();
    output = cmJoin(*components, ";");
  } else {
    const char* prop = CM_NULLPTR;
    if (!args[1].empty()) {
      prop = this->Makefile->GetState()->GetGlobalProperty(args[1]);
    }
    if (prop) {
      output = prop;
    }
  }

  this->Makefile->AddDefinition(variable, output.c_str());

  return true;
}